

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O3

bool ON_BytesToHexadecimalString
               (ON__UINT8 *bytes,size_t byte_count,bool bCapitalDigits,bool bReverse,char *str,
               size_t str_capacity)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  byte bVar4;
  ulong uVar5;
  int iVar6;
  byte *pbVar7;
  byte bVar8;
  char cVar9;
  
  bVar1 = byte_count * 2 <= str_capacity;
  bVar2 = bVar1 && str != (char *)0x0;
  if (bVar1 && str != (char *)0x0) {
    cVar3 = !bCapitalDigits * ' ' + '7';
    pbVar7 = bytes + 0x13;
    if (!bReverse) {
      pbVar7 = bytes;
    }
    iVar6 = 0x14;
    uVar5 = 0;
    do {
      bVar8 = *pbVar7;
      if (uVar5 < str_capacity) {
        bVar4 = bVar8 >> 4 | 0x30;
        if (0x9f < bVar8) {
          bVar4 = (bVar8 >> 4) + cVar3;
        }
        str[uVar5] = bVar4;
        uVar5 = uVar5 + 1;
      }
      if (uVar5 < str_capacity) {
        bVar8 = bVar8 & 0xf;
        cVar9 = bVar8 + 0x30;
        if (9 < bVar8) {
          cVar9 = bVar8 + cVar3;
        }
        str[uVar5] = cVar9;
        uVar5 = uVar5 + 1;
      }
      pbVar7 = pbVar7 + (-(ulong)bReverse | 1);
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    if (str_capacity <= uVar5) {
      return bVar2;
    }
    str = str + uVar5;
  }
  else if (str == (char *)0x0 || str_capacity == 0) {
    return bVar2;
  }
  *str = '\0';
  return bVar2;
}

Assistant:

static bool ON_BytesToHexadecimalString(
  const ON__UINT8* bytes,
  size_t byte_count,
  bool bCapitalDigits,
  bool bReverse,
  char* str,
  size_t str_capacity
  )
{
  if (nullptr == str || str_capacity < 2*byte_count || byte_count <= 0 || nullptr == bytes )
  {
    if (nullptr != str && str_capacity > 0)
      str[0] = 0;
    return false;
  }
  const int A_minus_10 = (bCapitalDigits ? 'A' : 'a') - 10;
  size_t j = 0;
  int c;
  if ( bReverse )
    bytes += 19;
  const int delta_byte = bReverse ? -1 : 1;
  for (int i = 0; i < 20; i++)
  {
    ON__UINT8 b = *bytes;
    bytes += delta_byte;
    c = (int)(b / 16);
    if (c < 10)
      c += '0';
    else
      c += A_minus_10;
    if (j < str_capacity)
      str[j++] = (char)c;
    c = (int)(b % 16);
    if (c < 10)
      c += '0';
    else
      c += A_minus_10;
    if (j < str_capacity)
      str[j++] = (char)c;
  }
  if ((size_t)j < str_capacity)
    str[j] = 0;
  return true;
}